

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsStatus.cpp
# Opt level: O0

HighsStatus
interpretCallStatus(HighsLogOptions *log_options,HighsStatus call_status,
                   HighsStatus from_return_status,string *message)

{
  HighsStatus HVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  HighsStatus in_EDX;
  HighsStatus in_ESI;
  HighsLogOptions *in_RDI;
  undefined8 in_R9;
  HighsStatus to_return_status;
  string *psVar4;
  string local_40 [28];
  HighsStatus in_stack_ffffffffffffffdc;
  
  HVar1 = worseStatus(in_ESI,in_EDX);
  if (in_ESI != kOk) {
    uVar2 = std::__cxx11::string::c_str();
    psVar4 = local_40;
    highsStatusToString_abi_cxx11_(in_stack_ffffffffffffffdc);
    uVar3 = std::__cxx11::string::c_str();
    highsLogDev(in_RDI,kWarning,"%s return of HighsStatus::%s\n",uVar2,uVar3,in_R9,psVar4);
    std::__cxx11::string::~string(local_40);
  }
  return HVar1;
}

Assistant:

HighsStatus interpretCallStatus(const HighsLogOptions log_options,
                                const HighsStatus call_status,
                                const HighsStatus from_return_status,
                                const std::string& message) {
  HighsStatus to_return_status;
  to_return_status = worseStatus(call_status, from_return_status);
  if (call_status != HighsStatus::kOk)
    highsLogDev(log_options, HighsLogType::kWarning,
                "%s return of HighsStatus::%s\n", message.c_str(),
                highsStatusToString(call_status).c_str());
  return to_return_status;
}